

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O1

uint ON_GetVersionWideString
               (uint major_version,uint minor_version,uint year,uint month,uint day_of_month,
               uint hour,uint minute,uint branch,size_t string_buffer_capacity,
               wchar_t *string_buffer)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  char s [24];
  
  s[0] = '\0';
  s[1] = '\0';
  s[2] = '\0';
  s[3] = '\0';
  s[4] = '\0';
  s[5] = '\0';
  s[6] = '\0';
  s[7] = '\0';
  s[8] = '\0';
  s[9] = '\0';
  s[10] = '\0';
  s[0xb] = '\0';
  s[0xc] = '\0';
  s[0xd] = '\0';
  s[0xe] = '\0';
  s[0xf] = '\0';
  s[0x10] = '\0';
  s[0x11] = '\0';
  s[0x12] = '\0';
  s[0x13] = '\0';
  s[0x14] = '\0';
  s[0x15] = '\0';
  s[0x16] = '\0';
  s[0x17] = '\0';
  uVar1 = ON_GetVersionString(major_version,minor_version,year,month,day_of_month,hour,minute,branch
                              ,0x18,s);
  if (string_buffer != (wchar_t *)0x0 && string_buffer_capacity != 0) {
    uVar2 = 0;
    if (string_buffer_capacity < uVar1) {
      uVar1 = 0;
    }
    else if (uVar1 != 0) {
      uVar2 = 0;
      do {
        if (s[uVar2] == '\0') goto LAB_0067209b;
        string_buffer[uVar2] = (int)s[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar1 != (uint)uVar2);
      uVar2 = (ulong)uVar1;
    }
LAB_0067209b:
    uVar3 = uVar2 & 0xffffffff;
    if (uVar3 < string_buffer_capacity) {
      uVar4 = (uint)uVar2;
      do {
        uVar4 = uVar4 + 1;
        string_buffer[uVar3] = L'\0';
        uVar3 = (ulong)uVar4;
      } while (uVar3 < string_buffer_capacity);
    }
  }
  return uVar1;
}

Assistant:

unsigned int ON_GetVersionWideString(
  unsigned int major_version,
  unsigned int minor_version,
  unsigned int year,
  unsigned int month,
  unsigned int day_of_month,
  unsigned int hour,
  unsigned int minute,
  unsigned int branch,
  size_t string_buffer_capacity,
  wchar_t* string_buffer
  )
{
  char s[24] = {0};
  const size_t s_capacity = sizeof(s)/sizeof(s[0]);
  unsigned int string_length;
  unsigned int i;

  string_length = ON_GetVersionString(
                    major_version,
                    minor_version,
                    year,
                    month,
                    day_of_month,
                    hour,
                    minute,
                    branch,
                    s_capacity, s
                    );
  
  if (string_buffer_capacity > 0 && nullptr != string_buffer)
  {
    if (((size_t)string_length) <= string_buffer_capacity)
    {
      for (i = 0; i < string_length && 0 != s[i]; i++)
      {
        string_buffer[i] = s[i];
      }
    }
    else
    {
      string_length = 0;
      i = 0;
    }

    while (i < string_buffer_capacity)
      string_buffer[i++] = 0;
  }
  
  return string_length;
}